

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

gid16 TtfUtil::Cmap310Lookup(void *pCmap310,uint uUnicodeId)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CmapSubTableFormat12 *pTable;
  undefined4 *puVar5;
  
  uVar3 = *(uint *)((long)pCmap310 + 0xc);
  if (uVar3 != 0) {
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    iVar4 = uVar3 + (uVar3 == 0);
    puVar5 = (undefined4 *)((long)pCmap310 + 0x18);
    do {
      uVar3 = puVar5[-2];
      uVar1 = puVar5[-1];
      uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8;
      if (uUnicodeId <=
          (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) &&
          (uVar2 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) <= uUnicodeId) {
        return ((short)uUnicodeId - (short)uVar2) +
               ((ushort)(byte)((uint)*puVar5 >> 0x18) | (ushort)((uint)*puVar5 >> 8) & 0xff00);
      }
      puVar5 = puVar5 + 3;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

gr::gid16 Cmap310Lookup(const void * pCmap310, unsigned int uUnicodeId)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	//uint32 uLength = read(pTable->length); //could use to test for premature end of table
	uint32 ucGroups = read(pTable->num_groups);

	for (unsigned int i = 0; i < ucGroups; i++)
	{
		uint32 uStartCode = read(pTable->group[i].start_char_code);
		uint32 uEndCode = read(pTable->group[i].end_char_code);
		if (uUnicodeId >= uStartCode && uUnicodeId <= uEndCode)
		{
			uint32 uDiff = uUnicodeId - uStartCode;
			uint32 uStartGid = read(pTable->group[i].start_glyph_id);
			return static_cast<gr::gid16>(uStartGid + uDiff);
		}
	}

	return 0;
}